

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

void bsp_remove_point_by_idx(void *handle,int idx)

{
  byte bVar1;
  float *point;
  ulong uVar2;
  
  bVar1 = *(byte *)((long)handle + 8);
  point = (float *)malloc((ulong)bVar1 << 2);
  for (uVar2 = 0; bVar1 != uVar2; uVar2 = uVar2 + 1) {
    point[uVar2] = *(float *)(*(long *)(*handle + uVar2 * 8) + (long)idx * 4);
  }
  bsp_remove_point(handle,point);
  free(point);
  return;
}

Assistant:

void
bsp_remove_point_by_idx(
    void * handle,
    int idx )
{
    bsp_tree * tree;
    float * point;
    int i;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    point = (float *)malloc( sizeof(float) * tree->dimensions );
    assert( point != NULL );
    for ( i = 0; i < tree->dimensions; i++ ) {
        point[i] = tree->pointarrays[i][idx];
    }
    bsp_remove_point( handle, point );
    free( point );
}